

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O1

void __thiscall
Sequence::insert_freqarray(Sequence *this,shared_ptr<Lists<std::shared_ptr<Eqclass>_>_> *LargeL)

{
  element_type *peVar1;
  Eqclass *this_00;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  uint uVar5;
  element_type *peVar6;
  shared_ptr<Lists<std::shared_ptr<Itemset>_>_> *psVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  Eqclass_S cluster;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  element_type *local_38;
  
  a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (LargeL->super___shared_ptr<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  peVar6 = (peVar1->theHead).
           super___shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var8 = (peVar1->theHead).
           super___shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
    }
  }
  if (peVar6 == (element_type *)0x0) {
    this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_40 = p_Var8;
    do {
      this_00 = (peVar6->theItem).super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_38 = peVar6;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (a_Stack_50,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(peVar6->theItem).super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2> +
                 8));
      psVar7 = Eqclass::list(this_00);
      peVar2 = (psVar7->
               super___shared_ptr<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      peVar3 = (peVar2->theHead).
               super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var8 = (peVar2->theHead).
               super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        }
      }
      if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
      }
      while (this_02 = p_Var8, peVar3 != (element_type *)0x0) {
        uVar5 = Eqclass::templ(this_00);
        add_freq(this,&peVar3->theItem,uVar5);
        peVar4 = (peVar3->theNext).
                 super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        p_Var8 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(peVar3->theNext).
                         super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                 + 8))->_M_pi;
        if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
          }
        }
        peVar3 = peVar4;
        if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
        }
      }
      psVar7 = Eqclass::list2(this_00);
      peVar2 = (psVar7->
               super___shared_ptr<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      peVar3 = (peVar2->theHead).
               super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var8 = (peVar2->theHead).
               super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        }
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      while (this_01 = p_Var8, peVar3 != (element_type *)0x0) {
        uVar5 = Eqclass::templ2(this_00);
        add_freq(this,&peVar3->theItem,uVar5);
        peVar4 = (peVar3->theNext).
                 super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        p_Var8 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(peVar3->theNext).
                         super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                 + 8))->_M_pi;
        if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
          }
        }
        peVar3 = peVar4;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
      }
      peVar6 = (local_38->theNext).
               super___shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var8 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(local_38->theNext).
                       super___shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>
               + 8))->_M_pi;
      if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
        }
      }
      if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
      }
      local_40 = p_Var8;
    } while (peVar6 != (element_type *)0x0);
  }
  if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
  }
  return;
}

Assistant:

void Sequence::insert_freqarray(shared_ptr<Lists<Eqclass_S>>& LargeL) {
    //insert frequent itemsets into hash table
    shared_ptr<ListNodes<Eqclass_S>> chd;
    shared_ptr<ListNodes<shared_ptr<Itemset>>> hdr1, hdr2;
    Eqclass_S cluster;

    chd = LargeL->head();
    for (; chd; chd = chd->next()) {
        cluster = chd->item();
        hdr1 = cluster->list()->head();
        for (; hdr1; hdr1 = hdr1->next()) {
            add_freq(hdr1->item(), cluster->templ());
            //hdr1->item()->print_seq(seqstrm, cluster->templ());
        }
        hdr2 = cluster->list2()->head();
        for (; hdr2; hdr2 = hdr2->next()) {
            add_freq(hdr2->item(), cluster->templ2());
            //hdr2->item()->print_seq(seqstrm, cluster->templ2());
        }
    }
}